

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O1

bool __thiscall Am_Value::operator==(Am_Value *this,Am_Wrapper *test_value)

{
  ushort uVar1;
  Am_Wrapper *pAVar2;
  int iVar3;
  uint uVar4;
  
  uVar1 = this->type;
  if ((uVar1 & 0x7000) != 0x2000) {
    uVar4 = (uint)uVar1;
    if ((uVar1 < 10) && ((0x20cU >> (uVar4 & 0x1f) & 1) != 0)) {
      return test_value == (Am_Wrapper *)0x0 && (this->value).wrapper_value == (Am_Wrapper *)0x0;
    }
    if ((uVar4 != 0x8008) && (uVar4 != 0x8006)) {
      return false;
    }
  }
  pAVar2 = (this->value).wrapper_value;
  if (pAVar2 == test_value) {
    return true;
  }
  if (pAVar2 == (Am_Wrapper *)0x0 || test_value == (Am_Wrapper *)0x0) {
    return false;
  }
  iVar3 = (*(pAVar2->super_Am_Registered_Type)._vptr_Am_Registered_Type[6])();
  return SUB41(iVar3,0);
}

Assistant:

bool
Am_Value::operator==(Am_Wrapper *test_value) const
{
  if (Am_Type_Class(type) == Am_WRAPPER)
    return (value.wrapper_value == test_value) ||
           (test_value && value.wrapper_value &&
            (*value.wrapper_value == *test_value));
  switch (type) {
  case Am_STRING:
  case Am_DOUBLE:
    return (value.wrapper_value == test_value) ||
           (test_value && value.wrapper_value &&
            (*value.wrapper_value == *test_value));
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    if (!value.voidptr_value)
      return test_value == nullptr;
  default:
    return false;
  }
}